

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

cmFileListGeneratorBase * __thiscall
cmFileListGeneratorBase::SetNext(cmFileListGeneratorBase *this,cmFileListGeneratorBase *next)

{
  cmFileListGeneratorBase *pcVar1;
  _Head_base<0UL,_cmFileListGeneratorBase_*,_false> _Var2;
  cmFileListGeneratorBase *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_cmFileListGeneratorBase_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  (*next->_vptr_cmFileListGeneratorBase[3])(&local_18);
  _Var2._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (cmFileListGeneratorBase *)0x0;
  pcVar1 = (this->Next)._M_t.
           super___uniq_ptr_impl<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmFileListGeneratorBase_*,_std::default_delete<cmFileListGeneratorBase>_>
           .super__Head_base<0UL,_cmFileListGeneratorBase_*,_false>._M_head_impl;
  (this->Next)._M_t.
  super___uniq_ptr_impl<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>._M_t
  .super__Tuple_impl<0UL,_cmFileListGeneratorBase_*,_std::default_delete<cmFileListGeneratorBase>_>.
  super__Head_base<0UL,_cmFileListGeneratorBase_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (pcVar1 != (cmFileListGeneratorBase *)0x0) {
    (*pcVar1->_vptr_cmFileListGeneratorBase[1])();
  }
  if (local_18._M_head_impl != (cmFileListGeneratorBase *)0x0) {
    (*(local_18._M_head_impl)->_vptr_cmFileListGeneratorBase[1])();
  }
  return (this->Next)._M_t.
         super___uniq_ptr_impl<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmFileListGeneratorBase_*,_std::default_delete<cmFileListGeneratorBase>_>
         .super__Head_base<0UL,_cmFileListGeneratorBase_*,_false>._M_head_impl;
}

Assistant:

cmFileListGeneratorBase* cmFileListGeneratorBase::SetNext(
  cmFileListGeneratorBase const& next)
{
  this->Next = next.Clone();
  return this->Next.get();
}